

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O1

TemporalBinInfo *
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::merge2(TemporalBinInfo *a,TemporalBinInfo *b)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  size_t sVar3;
  undefined8 uVar4;
  TemporalBinInfo *r;
  TemporalBinInfo *in_RDI;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  
  sVar3 = a->count1[0];
  in_RDI->count0[0] = a->count0[0];
  in_RDI->count1[0] = sVar3;
  aVar5 = a->bounds0[0].bounds0.lower.field_0;
  in_RDI->bounds0[0].bounds0.lower.field_0 = aVar5;
  aVar1 = a->bounds0[0].bounds0.upper.field_0;
  in_RDI->bounds0[0].bounds0.upper.field_0 = aVar1;
  uVar4 = *(undefined8 *)((long)&a->bounds0[0].bounds1.lower.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds0[0].bounds1.lower.field_0 =
       *(undefined8 *)&a->bounds0[0].bounds1.lower.field_0;
  *(undefined8 *)((long)&in_RDI->bounds0[0].bounds1.lower.field_0 + 8) = uVar4;
  uVar4 = *(undefined8 *)((long)&a->bounds0[0].bounds1.upper.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds0[0].bounds1.upper.field_0 =
       *(undefined8 *)&a->bounds0[0].bounds1.upper.field_0;
  *(undefined8 *)((long)&in_RDI->bounds0[0].bounds1.upper.field_0 + 8) = uVar4;
  aVar2 = a->bounds1[0].bounds0.lower.field_0;
  in_RDI->bounds1[0].bounds0.lower.field_0 = aVar2;
  uVar4 = *(undefined8 *)((long)&a->bounds1[0].bounds0.upper.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds1[0].bounds0.upper.field_0 =
       *(undefined8 *)&a->bounds1[0].bounds0.upper.field_0;
  *(undefined8 *)((long)&in_RDI->bounds1[0].bounds0.upper.field_0 + 8) = uVar4;
  uVar4 = *(undefined8 *)((long)&a->bounds1[0].bounds1.lower.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds1[0].bounds1.lower.field_0 =
       *(undefined8 *)&a->bounds1[0].bounds1.lower.field_0;
  *(undefined8 *)((long)&in_RDI->bounds1[0].bounds1.lower.field_0 + 8) = uVar4;
  uVar4 = *(undefined8 *)((long)&a->bounds1[0].bounds1.upper.field_0 + 8);
  *(undefined8 *)&in_RDI->bounds1[0].bounds1.upper.field_0 =
       *(undefined8 *)&a->bounds1[0].bounds1.upper.field_0;
  *(undefined8 *)((long)&in_RDI->bounds1[0].bounds1.upper.field_0 + 8) = uVar4;
  sVar3 = b->count1[0];
  in_RDI->count0[0] = in_RDI->count0[0] + b->count0[0];
  in_RDI->count1[0] = in_RDI->count1[0] + sVar3;
  aVar5.m128 = (__m128)minps(aVar5.m128,b->bounds0[0].bounds0.lower.field_0);
  in_RDI->bounds0[0].bounds0.lower.field_0 = aVar5;
  aVar5.m128 = (__m128)maxps(aVar1.m128,b->bounds0[0].bounds0.upper.field_0);
  in_RDI->bounds0[0].bounds0.upper.field_0 = aVar5;
  aVar5.m128 = (__m128)minps(in_RDI->bounds0[0].bounds1.lower.field_0,
                             b->bounds0[0].bounds1.lower.field_0);
  in_RDI->bounds0[0].bounds1.lower.field_0 = aVar5;
  aVar5.m128 = (__m128)maxps(in_RDI->bounds0[0].bounds1.upper.field_0,
                             b->bounds0[0].bounds1.upper.field_0);
  in_RDI->bounds0[0].bounds1.upper.field_0 = aVar5;
  aVar5.m128 = (__m128)minps(aVar2.m128,b->bounds1[0].bounds0.lower.field_0);
  in_RDI->bounds1[0].bounds0.lower.field_0 = aVar5;
  aVar5.m128 = (__m128)maxps(in_RDI->bounds1[0].bounds0.upper.field_0,
                             b->bounds1[0].bounds0.upper.field_0);
  in_RDI->bounds1[0].bounds0.upper.field_0 = aVar5;
  aVar5.m128 = (__m128)minps(in_RDI->bounds1[0].bounds1.lower.field_0,
                             b->bounds1[0].bounds1.lower.field_0);
  in_RDI->bounds1[0].bounds1.lower.field_0 = aVar5;
  aVar5.m128 = (__m128)maxps(in_RDI->bounds1[0].bounds1.upper.field_0,
                             b->bounds1[0].bounds1.upper.field_0);
  in_RDI->bounds1[0].bounds1.upper.field_0 = aVar5;
  return in_RDI;
}

Assistant:

static __forceinline const TemporalBinInfo merge2(const TemporalBinInfo& a, const TemporalBinInfo& b) {
            TemporalBinInfo r = a; r.merge(b); return r;
          }